

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O1

SVInt __thiscall slang::SVInt::operator~(SVInt *this)

{
  uint uVar1;
  ulong *puVar2;
  bool bVar3;
  uint64_t *puVar4;
  ulong uVar5;
  undefined8 extraout_RDX;
  SVIntStorage *in_RSI;
  ulong uVar6;
  SVInt SVar7;
  
  SVInt(this,in_RSI);
  uVar1 = in_RSI->bitWidth + 0x3f;
  bVar3 = in_RSI->unknownFlag;
  if (in_RSI->bitWidth < 0x41 && (bVar3 & 1U) == 0) {
    (this->super_SVIntStorage).field_0.val = ~(this->super_SVIntStorage).field_0.val;
  }
  else if (0x3f < uVar1) {
    uVar6 = 0;
    do {
      puVar2 = (this->super_SVIntStorage).field_0.pVal + uVar6;
      *puVar2 = ~*puVar2;
      uVar6 = uVar6 + 1;
    } while (uVar1 >> 6 != uVar6);
  }
  if (0x3f < uVar1 && (~bVar3 & 1U) == 0) {
    uVar6 = (ulong)((uVar1 >> 6) << 3);
    uVar5 = 0;
    do {
      puVar4 = (this->super_SVIntStorage).field_0.pVal;
      puVar2 = (ulong *)((long)puVar4 + uVar5);
      *puVar2 = *puVar2 & ~*(ulong *)((long)puVar4 + uVar6 + uVar5);
      uVar5 = uVar5 + 8;
    } while (uVar6 != uVar5);
  }
  clearUnusedBits(this);
  SVar7.super_SVIntStorage.bitWidth = (int)extraout_RDX;
  SVar7.super_SVIntStorage.signFlag = (bool)(char)((ulong)extraout_RDX >> 0x20);
  SVar7.super_SVIntStorage.unknownFlag = (bool)(char)((ulong)extraout_RDX >> 0x28);
  SVar7.super_SVIntStorage._14_2_ = (short)((ulong)extraout_RDX >> 0x30);
  SVar7.super_SVIntStorage.field_0.pVal = (uint64_t *)this;
  return (SVInt)SVar7.super_SVIntStorage;
}

Assistant:

SVInt SVInt::operator~() const {
    SVInt result(*this);
    uint32_t words = getNumWords(bitWidth, false);

    // just use xor to quickly flip everything
    if (isSingleWord())
        result.val ^= UINT64_MAX;
    else {
        for (uint32_t i = 0; i < words; i++)
            result.pVal[i] ^= UINT64_MAX;
    }

    if (unknownFlag) {
        // any unknown bits are still unknown, but we need to make sure
        // any high impedance values become X's
        for (uint32_t i = 0; i < words; i++)
            result.pVal[i] &= ~result.pVal[i + words];
    }

    result.clearUnusedBits();
    return result;
}